

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.cpp
# Opt level: O2

void PrintExceptionContinue(exception *pex,string_view thread_name)

{
  long lVar1;
  string_view source_file;
  bool bVar2;
  Logger *pLVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  basic_string_view<char,_std::char_traits<char>_> *in_R8;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view str;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff08;
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  char *local_70 [4];
  char *pszModule;
  char *pcStack_48;
  string log_msg;
  
  log_msg._M_string_length = (size_type)thread_name._M_str;
  log_msg._M_dataplus._M_p = (pointer)thread_name._M_len;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pszModule = "bitcoin";
  if (pex == (exception *)0x0) {
    args = &log_msg;
    tinyformat::format<char_const*,std::basic_string_view<char,std::char_traits<char>>>
              (&message,(tinyformat *)"UNKNOWN EXCEPTION       \n%s in %s       \n",
               (char *)&pszModule,(char **)args,in_R8);
  }
  else {
    local_70[0] = *(char **)(*(long *)(*(long *)pex + -8) + 8);
    local_70[0] = local_70[0] + (*local_70[0] == '*');
    local_90._M_dataplus._M_p = (pointer)(**(code **)(*(long *)pex + 0x10))();
    args = &local_90;
    tinyformat::
    format<char_const*,char_const*,char_const*,std::basic_string_view<char,std::char_traits<char>>>
              (&message,(tinyformat *)"EXCEPTION: %s       \n%s       \n%s in %s       \n",
               (char *)local_70,(char **)args,&pszModule,(char **)&log_msg,in_stack_ffffffffffffff08
              );
  }
  pLVar3 = LogInstance();
  bVar2 = BCLog::Logger::Enabled(pLVar3);
  if (bVar2) {
    log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
    log_msg._M_string_length = 0;
    log_msg.field_2._M_local_buf[0] = '\0';
    tinyformat::format<std::__cxx11::string>
              ((string *)&pszModule,(tinyformat *)"\n\n************************\n%s\n",
               (char *)&message,args);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&log_msg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &pszModule);
    std::__cxx11::string::~string((string *)&pszModule);
    pLVar3 = LogInstance();
    pszModule = (char *)0x5b;
    pcStack_48 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/util/exception.cpp";
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/util/exception.cpp"
    ;
    source_file._M_len = 0x5b;
    logging_function._M_str = "PrintExceptionContinue";
    logging_function._M_len = 0x16;
    str._M_str = log_msg._M_dataplus._M_p;
    str._M_len = log_msg._M_string_length;
    BCLog::Logger::LogPrintStr(pLVar3,str,logging_function,source_file,0x27,ALL,Info);
    std::__cxx11::string::~string((string *)&log_msg);
  }
  tinyformat::format<std::__cxx11::string>
            ((ostream *)&std::cerr,"\n\n************************\n%s\n",&message);
  std::__cxx11::string::~string((string *)&message);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PrintExceptionContinue(const std::exception* pex, std::string_view thread_name)
{
    std::string message = FormatException(pex, thread_name);
    LogPrintf("\n\n************************\n%s\n", message);
    tfm::format(std::cerr, "\n\n************************\n%s\n", message);
}